

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.cpp
# Opt level: O0

string * __thiscall
TgBot::HttpParser::generateResponse
          (string *__return_storage_ptr__,HttpParser *this,string *data,string *mimeType,
          unsigned_short statusCode,string *statusStr,bool isKeepAlive)

{
  unsigned_long __val;
  string local_90;
  string local_70;
  undefined1 local_3a;
  byte local_39;
  string *psStack_38;
  bool isKeepAlive_local;
  string *statusStr_local;
  string *psStack_28;
  unsigned_short statusCode_local;
  string *mimeType_local;
  string *data_local;
  HttpParser *this_local;
  string *result;
  
  local_39 = isKeepAlive;
  local_3a = 0;
  psStack_38 = statusStr;
  statusStr_local._6_2_ = statusCode;
  psStack_28 = mimeType;
  mimeType_local = data;
  data_local = (string *)this;
  this_local = (HttpParser *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"HTTP/1.1 ");
  std::__cxx11::to_string(&local_70,(uint)statusStr_local._6_2_);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,' ');
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psStack_38);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\r\nContent-Type: ");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psStack_28);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\r\nContent-Length: ");
  __val = std::__cxx11::string::length();
  std::__cxx11::to_string(&local_90,__val);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\r\nConnection: ");
  if ((local_39 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"close");
  }
  else {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"keep-alive");
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\r\n\r\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)mimeType_local);
  return __return_storage_ptr__;
}

Assistant:

string HttpParser::generateResponse(const string& data, const string& mimeType, unsigned short statusCode, const string& statusStr, bool isKeepAlive) const {
    string result;
    result += "HTTP/1.1 ";
    result += std::to_string(statusCode);
    result += ' ';
    result += statusStr;
    result += "\r\nContent-Type: ";
    result += mimeType;
    result += "\r\nContent-Length: ";
    result += std::to_string(data.length());
    result += "\r\nConnection: ";
    if (isKeepAlive) {
        result += "keep-alive";
    } else {
        result += "close";
    }
    result += "\r\n\r\n";
    result += data;
    return result;
}